

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

int __thiscall base_uint<256U>::CompareTo(base_uint<256U> *this,base_uint<256U> *b)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  ulong uVar4;
  
  uVar2 = 7;
  iVar1 = -1;
  do {
    if ((int)uVar2 < 0) {
      iVar1 = 0;
      goto LAB_00152b1e;
    }
    uVar3 = (ulong)uVar2;
    uVar4 = (ulong)uVar2;
    if (this->pn[uVar3] < b->pn[uVar4]) goto LAB_00152b1e;
    uVar2 = uVar2 - 1;
  } while (this->pn[uVar3] <= b->pn[uVar4]);
  iVar1 = 1;
LAB_00152b1e:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int base_uint<BITS>::CompareTo(const base_uint<BITS>& b) const
{
    for (int i = WIDTH - 1; i >= 0; i--) {
        if (pn[i] < b.pn[i])
            return -1;
        if (pn[i] > b.pn[i])
            return 1;
    }
    return 0;
}